

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

OSType parseOS(StringRef OSName)

{
  bool bVar1;
  OSType *pOVar2;
  StringLiteral local_f68;
  StringLiteral local_f58;
  StringLiteral local_f48;
  StringLiteral local_f38;
  StringLiteral local_f28;
  StringLiteral local_f18;
  StringLiteral local_f08;
  StringLiteral local_ef8;
  StringLiteral local_ee8;
  StringLiteral local_ed8;
  StringLiteral local_ec8;
  StringLiteral local_eb8;
  StringLiteral local_ea8;
  StringLiteral local_e98;
  StringLiteral local_e88;
  StringLiteral local_e78;
  StringLiteral local_e68;
  StringLiteral local_e58;
  StringLiteral local_e48;
  StringLiteral local_e38;
  StringLiteral local_e28;
  StringLiteral local_e18;
  StringLiteral local_e08;
  StringLiteral local_df8;
  StringLiteral local_de8;
  StringLiteral local_dd8;
  StringLiteral local_dc8;
  StringLiteral local_db8;
  StringLiteral local_da8;
  StringLiteral local_d98;
  StringLiteral local_d88;
  StringLiteral local_d78;
  char *local_d68;
  char *local_d60;
  char *local_d58;
  char *local_d50;
  Optional<llvm::Triple::OSType> OStack_d48;
  char *local_d40;
  StringRef OSName_local;
  OSType local_d04;
  char **local_d00;
  char *local_cf8;
  char *local_cf0;
  char **local_ce8;
  char *local_ce0;
  char *local_cd8;
  char *local_cd0;
  char *local_cc8;
  char *local_cc0;
  int local_cb4;
  char *local_cb0;
  char *local_ca8;
  OSType local_c9c;
  char **local_c98;
  char *local_c90;
  char *local_c88;
  char **local_c80;
  char *local_c78;
  char *local_c70;
  char *local_c68;
  char *local_c60;
  char *local_c58;
  int local_c4c;
  char *local_c48;
  char *local_c40;
  OSType local_c34;
  char **local_c30;
  char *local_c28;
  char *local_c20;
  char **local_c18;
  char *local_c10;
  char *local_c08;
  char *local_c00;
  char *local_bf8;
  char *local_bf0;
  int local_be4;
  char *local_be0;
  char *local_bd8;
  OSType local_bcc;
  char **local_bc8;
  char *local_bc0;
  char *local_bb8;
  char **local_bb0;
  char *local_ba8;
  char *local_ba0;
  char *local_b98;
  char *local_b90;
  char *local_b88;
  int local_b7c;
  char *local_b78;
  char *local_b70;
  OSType local_b64;
  char **local_b60;
  char *local_b58;
  char *local_b50;
  char **local_b48;
  char *local_b40;
  char *local_b38;
  char *local_b30;
  char *local_b28;
  char *local_b20;
  int local_b14;
  char *local_b10;
  char *local_b08;
  OSType local_afc;
  char **local_af8;
  char *local_af0;
  char *local_ae8;
  char **local_ae0;
  char *local_ad8;
  char *local_ad0;
  char *local_ac8;
  char *local_ac0;
  char *local_ab8;
  int local_aac;
  char *local_aa8;
  char *local_aa0;
  OSType local_a94;
  char **local_a90;
  char *local_a88;
  char *local_a80;
  char **local_a78;
  char *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  char *local_a50;
  int local_a44;
  char *local_a40;
  char *local_a38;
  OSType local_a2c;
  char **local_a28;
  char *local_a20;
  char *local_a18;
  char **local_a10;
  char *local_a08;
  char *local_a00;
  char *local_9f8;
  char *local_9f0;
  char *local_9e8;
  int local_9dc;
  char *local_9d8;
  char *local_9d0;
  OSType local_9c4;
  char **local_9c0;
  char *local_9b8;
  char *local_9b0;
  char **local_9a8;
  char *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  char *local_980;
  int local_974;
  char *local_970;
  char *local_968;
  OSType local_95c;
  char **local_958;
  char *local_950;
  char *local_948;
  char **local_940;
  char *local_938;
  char *local_930;
  char *local_928;
  char *local_920;
  char *local_918;
  int local_90c;
  char *local_908;
  char *local_900;
  OSType local_8f4;
  char **local_8f0;
  char *local_8e8;
  char *local_8e0;
  char **local_8d8;
  char *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  int local_8a4;
  char *local_8a0;
  char *local_898;
  OSType local_88c;
  char **local_888;
  char *local_880;
  char *local_878;
  char **local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  int local_83c;
  char *local_838;
  char *local_830;
  OSType local_824;
  char **local_820;
  char *local_818;
  char *local_810;
  char **local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  int local_7d4;
  char *local_7d0;
  char *local_7c8;
  OSType local_7bc;
  char **local_7b8;
  char *local_7b0;
  char *local_7a8;
  char **local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  int local_76c;
  char *local_768;
  char *local_760;
  OSType local_754;
  char **local_750;
  char *local_748;
  char *local_740;
  char **local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  int local_704;
  char *local_700;
  char *local_6f8;
  OSType local_6ec;
  char **local_6e8;
  char *local_6e0;
  char *local_6d8;
  char **local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  int local_69c;
  char *local_698;
  char *local_690;
  OSType local_684;
  char **local_680;
  char *local_678;
  char *local_670;
  char **local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  int local_634;
  char *local_630;
  char *local_628;
  OSType local_61c;
  char **local_618;
  char *local_610;
  char *local_608;
  char **local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  int local_5cc;
  char *local_5c8;
  char *local_5c0;
  OSType local_5b4;
  char **local_5b0;
  char *local_5a8;
  char *local_5a0;
  char **local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  int local_564;
  char *local_560;
  char *local_558;
  OSType local_54c;
  char **local_548;
  char *local_540;
  char *local_538;
  char **local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  int local_4fc;
  char *local_4f8;
  char *local_4f0;
  OSType local_4e4;
  char **local_4e0;
  char *local_4d8;
  char *local_4d0;
  char **local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  int local_494;
  char *local_490;
  char *local_488;
  OSType local_47c;
  char **local_478;
  char *local_470;
  char *local_468;
  char **local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  int local_42c;
  char *local_428;
  char *local_420;
  OSType local_414;
  char **local_410;
  char *local_408;
  char *local_400;
  char **local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  int local_3c4;
  char *local_3c0;
  char *local_3b8;
  OSType local_3ac;
  char **local_3a8;
  char *local_3a0;
  char *local_398;
  char **local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  int local_35c;
  char *local_358;
  char *local_350;
  OSType local_344;
  char **local_340;
  char *local_338;
  char *local_330;
  char **local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  int local_2f4;
  char *local_2f0;
  char *local_2e8;
  OSType local_2dc;
  char **local_2d8;
  char *local_2d0;
  char *local_2c8;
  char **local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  int local_28c;
  char *local_288;
  char *local_280;
  OSType local_274;
  char **local_270;
  char *local_268;
  char *local_260;
  char **local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  int local_224;
  char *local_220;
  char *local_218;
  OSType local_20c;
  char **local_208;
  char *local_200;
  char *local_1f8;
  char **local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  int local_1bc;
  char *local_1b8;
  char *local_1b0;
  OSType local_1a4;
  char **local_1a0;
  char *local_198;
  char *local_190;
  char **local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  int local_154;
  char *local_150;
  char *local_148;
  OSType local_13c;
  char **local_138;
  char *local_130;
  char *local_128;
  char **local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  int local_ec;
  char *local_e8;
  char *local_e0;
  OSType local_d4;
  char **local_d0;
  char *local_c8;
  char *local_c0;
  char **local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  int local_84;
  char *local_80;
  char *local_78;
  OSType local_6c;
  char **local_68;
  char *local_60;
  char *local_58;
  char **local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  int local_20;
  OSType local_1c;
  char **local_18;
  OSType local_c;
  
  local_d60 = (char *)OSName.Length;
  local_d68 = OSName.Data;
  OSName_local.Length = (size_t)&local_d58;
  local_d40 = local_d68;
  OSName_local.Data = local_d60;
  local_d58 = local_d68;
  local_d50 = local_d60;
  llvm::Optional<llvm::Triple::OSType>::Optional(&OStack_d48);
  llvm::StringLiteral::StringLiteral<7UL>(&local_d78,(char (*) [7])"ananas");
  local_60 = local_d78.super_StringRef.Data;
  local_58 = (char *)local_d78.super_StringRef.Length;
  local_6c = Ananas;
  local_68 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_80 = local_60;
    local_78 = local_58;
    local_48 = local_60;
    local_40 = local_58;
    bVar1 = false;
    local_50 = &local_d58;
    if (local_58 <= local_d50) {
      local_28 = local_d58;
      local_30 = local_60;
      local_38 = local_58;
      if (local_58 == (char *)0x0) {
        local_20 = 0;
      }
      else {
        local_20 = memcmp(local_d58,local_60,(size_t)local_58);
      }
      bVar1 = local_20 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_6c);
    }
  }
  llvm::StringLiteral::StringLiteral<9UL>(&local_d88,(char (*) [9])"cloudabi");
  local_c8 = local_d88.super_StringRef.Data;
  local_c0 = (char *)local_d88.super_StringRef.Length;
  local_d4 = CloudABI;
  local_d0 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_e8 = local_c8;
    local_e0 = local_c0;
    local_b0 = local_c8;
    local_a8 = local_c0;
    bVar1 = false;
    local_b8 = &local_d58;
    if (local_c0 <= local_d50) {
      local_90 = local_d58;
      local_98 = local_c8;
      local_a0 = local_c0;
      if (local_c0 == (char *)0x0) {
        local_84 = 0;
      }
      else {
        local_84 = memcmp(local_d58,local_c8,(size_t)local_c0);
      }
      bVar1 = local_84 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_d4);
    }
  }
  llvm::StringLiteral::StringLiteral<7UL>(&local_d98,(char (*) [7])0x2eadfe);
  local_130 = local_d98.super_StringRef.Data;
  local_128 = (char *)local_d98.super_StringRef.Length;
  local_13c = Darwin;
  local_138 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_150 = local_130;
    local_148 = local_128;
    local_118 = local_130;
    local_110 = local_128;
    bVar1 = false;
    local_120 = &local_d58;
    if (local_128 <= local_d50) {
      local_f8 = local_d58;
      local_100 = local_130;
      local_108 = local_128;
      if (local_128 == (char *)0x0) {
        local_ec = 0;
      }
      else {
        local_ec = memcmp(local_d58,local_130,(size_t)local_128);
      }
      bVar1 = local_ec == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_13c);
    }
  }
  llvm::StringLiteral::StringLiteral<10UL>(&local_da8,(char (*) [10])"dragonfly");
  local_198 = local_da8.super_StringRef.Data;
  local_190 = (char *)local_da8.super_StringRef.Length;
  local_1a4 = DragonFly;
  local_1a0 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_1b8 = local_198;
    local_1b0 = local_190;
    local_180 = local_198;
    local_178 = local_190;
    bVar1 = false;
    local_188 = &local_d58;
    if (local_190 <= local_d50) {
      local_160 = local_d58;
      local_168 = local_198;
      local_170 = local_190;
      if (local_190 == (char *)0x0) {
        local_154 = 0;
      }
      else {
        local_154 = memcmp(local_d58,local_198,(size_t)local_190);
      }
      bVar1 = local_154 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_1a4);
    }
  }
  llvm::StringLiteral::StringLiteral<8UL>(&local_db8,(char (*) [8])0x2ebf73);
  local_200 = local_db8.super_StringRef.Data;
  local_1f8 = (char *)local_db8.super_StringRef.Length;
  local_20c = FreeBSD;
  local_208 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_220 = local_200;
    local_218 = local_1f8;
    local_1e8 = local_200;
    local_1e0 = local_1f8;
    bVar1 = false;
    local_1f0 = &local_d58;
    if (local_1f8 <= local_d50) {
      local_1c8 = local_d58;
      local_1d0 = local_200;
      local_1d8 = local_1f8;
      if (local_1f8 == (char *)0x0) {
        local_1bc = 0;
      }
      else {
        local_1bc = memcmp(local_d58,local_200,(size_t)local_1f8);
      }
      bVar1 = local_1bc == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_20c);
    }
  }
  llvm::StringLiteral::StringLiteral<8UL>(&local_dc8,(char (*) [8])"fuchsia");
  local_268 = local_dc8.super_StringRef.Data;
  local_260 = (char *)local_dc8.super_StringRef.Length;
  local_274 = Fuchsia;
  local_270 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_288 = local_268;
    local_280 = local_260;
    local_250 = local_268;
    local_248 = local_260;
    bVar1 = false;
    local_258 = &local_d58;
    if (local_260 <= local_d50) {
      local_230 = local_d58;
      local_238 = local_268;
      local_240 = local_260;
      if (local_260 == (char *)0x0) {
        local_224 = 0;
      }
      else {
        local_224 = memcmp(local_d58,local_268,(size_t)local_260);
      }
      bVar1 = local_224 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_274);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_dd8,(char (*) [4])"ios");
  local_2d0 = local_dd8.super_StringRef.Data;
  local_2c8 = (char *)local_dd8.super_StringRef.Length;
  local_2dc = IOS;
  local_2d8 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_2f0 = local_2d0;
    local_2e8 = local_2c8;
    local_2b8 = local_2d0;
    local_2b0 = local_2c8;
    bVar1 = false;
    local_2c0 = &local_d58;
    if (local_2c8 <= local_d50) {
      local_298 = local_d58;
      local_2a0 = local_2d0;
      local_2a8 = local_2c8;
      if (local_2c8 == (char *)0x0) {
        local_28c = 0;
      }
      else {
        local_28c = memcmp(local_d58,local_2d0,(size_t)local_2c8);
      }
      bVar1 = local_28c == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_2dc);
    }
  }
  llvm::StringLiteral::StringLiteral<9UL>(&local_de8,(char (*) [9])"kfreebsd");
  local_338 = local_de8.super_StringRef.Data;
  local_330 = (char *)local_de8.super_StringRef.Length;
  local_344 = KFreeBSD;
  local_340 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_358 = local_338;
    local_350 = local_330;
    local_320 = local_338;
    local_318 = local_330;
    bVar1 = false;
    local_328 = &local_d58;
    if (local_330 <= local_d50) {
      local_300 = local_d58;
      local_308 = local_338;
      local_310 = local_330;
      if (local_330 == (char *)0x0) {
        local_2f4 = 0;
      }
      else {
        local_2f4 = memcmp(local_d58,local_338,(size_t)local_330);
      }
      bVar1 = local_2f4 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_344);
    }
  }
  llvm::StringLiteral::StringLiteral<6UL>(&local_df8,(char (*) [6])0x2ee781);
  local_3a0 = local_df8.super_StringRef.Data;
  local_398 = (char *)local_df8.super_StringRef.Length;
  local_3ac = Linux;
  local_3a8 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_3c0 = local_3a0;
    local_3b8 = local_398;
    local_388 = local_3a0;
    local_380 = local_398;
    bVar1 = false;
    local_390 = &local_d58;
    if (local_398 <= local_d50) {
      local_368 = local_d58;
      local_370 = local_3a0;
      local_378 = local_398;
      if (local_398 == (char *)0x0) {
        local_35c = 0;
      }
      else {
        local_35c = memcmp(local_d58,local_3a0,(size_t)local_398);
      }
      bVar1 = local_35c == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_3ac);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_e08,(char (*) [4])"lv2");
  local_408 = local_e08.super_StringRef.Data;
  local_400 = (char *)local_e08.super_StringRef.Length;
  local_414 = Lv2;
  local_410 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_428 = local_408;
    local_420 = local_400;
    local_3f0 = local_408;
    local_3e8 = local_400;
    bVar1 = false;
    local_3f8 = &local_d58;
    if (local_400 <= local_d50) {
      local_3d0 = local_d58;
      local_3d8 = local_408;
      local_3e0 = local_400;
      if (local_400 == (char *)0x0) {
        local_3c4 = 0;
      }
      else {
        local_3c4 = memcmp(local_d58,local_408,(size_t)local_400);
      }
      bVar1 = local_3c4 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_414);
    }
  }
  llvm::StringLiteral::StringLiteral<6UL>(&local_e18,(char (*) [6])0x2eae06);
  local_470 = local_e18.super_StringRef.Data;
  local_468 = (char *)local_e18.super_StringRef.Length;
  local_47c = MacOSX;
  local_478 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_490 = local_470;
    local_488 = local_468;
    local_458 = local_470;
    local_450 = local_468;
    bVar1 = false;
    local_460 = &local_d58;
    if (local_468 <= local_d50) {
      local_438 = local_d58;
      local_440 = local_470;
      local_448 = local_468;
      if (local_468 == (char *)0x0) {
        local_42c = 0;
      }
      else {
        local_42c = memcmp(local_d58,local_470,(size_t)local_468);
      }
      bVar1 = local_42c == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_47c);
    }
  }
  llvm::StringLiteral::StringLiteral<7UL>(&local_e28,(char (*) [7])"netbsd");
  local_4d8 = local_e28.super_StringRef.Data;
  local_4d0 = (char *)local_e28.super_StringRef.Length;
  local_4e4 = NetBSD;
  local_4e0 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_4f8 = local_4d8;
    local_4f0 = local_4d0;
    local_4c0 = local_4d8;
    local_4b8 = local_4d0;
    bVar1 = false;
    local_4c8 = &local_d58;
    if (local_4d0 <= local_d50) {
      local_4a0 = local_d58;
      local_4a8 = local_4d8;
      local_4b0 = local_4d0;
      if (local_4d0 == (char *)0x0) {
        local_494 = 0;
      }
      else {
        local_494 = memcmp(local_d58,local_4d8,(size_t)local_4d0);
      }
      bVar1 = local_494 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_4e4);
    }
  }
  llvm::StringLiteral::StringLiteral<8UL>(&local_e38,(char (*) [8])"openbsd");
  local_540 = local_e38.super_StringRef.Data;
  local_538 = (char *)local_e38.super_StringRef.Length;
  local_54c = OpenBSD;
  local_548 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_560 = local_540;
    local_558 = local_538;
    local_528 = local_540;
    local_520 = local_538;
    bVar1 = false;
    local_530 = &local_d58;
    if (local_538 <= local_d50) {
      local_508 = local_d58;
      local_510 = local_540;
      local_518 = local_538;
      if (local_538 == (char *)0x0) {
        local_4fc = 0;
      }
      else {
        local_4fc = memcmp(local_d58,local_540,(size_t)local_538);
      }
      bVar1 = local_4fc == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_54c);
    }
  }
  llvm::StringLiteral::StringLiteral<8UL>(&local_e48,(char (*) [8])"solaris");
  local_5a8 = local_e48.super_StringRef.Data;
  local_5a0 = (char *)local_e48.super_StringRef.Length;
  local_5b4 = Solaris;
  local_5b0 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_5c8 = local_5a8;
    local_5c0 = local_5a0;
    local_590 = local_5a8;
    local_588 = local_5a0;
    bVar1 = false;
    local_598 = &local_d58;
    if (local_5a0 <= local_d50) {
      local_570 = local_d58;
      local_578 = local_5a8;
      local_580 = local_5a0;
      if (local_5a0 == (char *)0x0) {
        local_564 = 0;
      }
      else {
        local_564 = memcmp(local_d58,local_5a8,(size_t)local_5a0);
      }
      bVar1 = local_564 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_5b4);
    }
  }
  llvm::StringLiteral::StringLiteral<6UL>(&local_e58,(char (*) [6])"win32");
  local_610 = local_e58.super_StringRef.Data;
  local_608 = (char *)local_e58.super_StringRef.Length;
  local_61c = Win32;
  local_618 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_630 = local_610;
    local_628 = local_608;
    local_5f8 = local_610;
    local_5f0 = local_608;
    bVar1 = false;
    local_600 = &local_d58;
    if (local_608 <= local_d50) {
      local_5d8 = local_d58;
      local_5e0 = local_610;
      local_5e8 = local_608;
      if (local_608 == (char *)0x0) {
        local_5cc = 0;
      }
      else {
        local_5cc = memcmp(local_d58,local_610,(size_t)local_608);
      }
      bVar1 = local_5cc == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_61c);
    }
  }
  llvm::StringLiteral::StringLiteral<8UL>(&local_e68,(char (*) [8])"windows");
  local_678 = local_e68.super_StringRef.Data;
  local_670 = (char *)local_e68.super_StringRef.Length;
  local_684 = Win32;
  local_680 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_698 = local_678;
    local_690 = local_670;
    local_660 = local_678;
    local_658 = local_670;
    bVar1 = false;
    local_668 = &local_d58;
    if (local_670 <= local_d50) {
      local_640 = local_d58;
      local_648 = local_678;
      local_650 = local_670;
      if (local_670 == (char *)0x0) {
        local_634 = 0;
      }
      else {
        local_634 = memcmp(local_d58,local_678,(size_t)local_670);
      }
      bVar1 = local_634 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_684);
    }
  }
  llvm::StringLiteral::StringLiteral<6UL>(&local_e78,(char (*) [6])"haiku");
  local_6e0 = local_e78.super_StringRef.Data;
  local_6d8 = (char *)local_e78.super_StringRef.Length;
  local_6ec = Haiku;
  local_6e8 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_700 = local_6e0;
    local_6f8 = local_6d8;
    local_6c8 = local_6e0;
    local_6c0 = local_6d8;
    bVar1 = false;
    local_6d0 = &local_d58;
    if (local_6d8 <= local_d50) {
      local_6a8 = local_d58;
      local_6b0 = local_6e0;
      local_6b8 = local_6d8;
      if (local_6d8 == (char *)0x0) {
        local_69c = 0;
      }
      else {
        local_69c = memcmp(local_d58,local_6e0,(size_t)local_6d8);
      }
      bVar1 = local_69c == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_6ec);
    }
  }
  llvm::StringLiteral::StringLiteral<6UL>(&local_e88,(char (*) [6])"minix");
  local_748 = local_e88.super_StringRef.Data;
  local_740 = (char *)local_e88.super_StringRef.Length;
  local_754 = Minix;
  local_750 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_768 = local_748;
    local_760 = local_740;
    local_730 = local_748;
    local_728 = local_740;
    bVar1 = false;
    local_738 = &local_d58;
    if (local_740 <= local_d50) {
      local_710 = local_d58;
      local_718 = local_748;
      local_720 = local_740;
      if (local_740 == (char *)0x0) {
        local_704 = 0;
      }
      else {
        local_704 = memcmp(local_d58,local_748,(size_t)local_740);
      }
      bVar1 = local_704 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_754);
    }
  }
  llvm::StringLiteral::StringLiteral<6UL>(&local_e98,(char (*) [6])"rtems");
  local_7b0 = local_e98.super_StringRef.Data;
  local_7a8 = (char *)local_e98.super_StringRef.Length;
  local_7bc = RTEMS;
  local_7b8 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_7d0 = local_7b0;
    local_7c8 = local_7a8;
    local_798 = local_7b0;
    local_790 = local_7a8;
    bVar1 = false;
    local_7a0 = &local_d58;
    if (local_7a8 <= local_d50) {
      local_778 = local_d58;
      local_780 = local_7b0;
      local_788 = local_7a8;
      if (local_7a8 == (char *)0x0) {
        local_76c = 0;
      }
      else {
        local_76c = memcmp(local_d58,local_7b0,(size_t)local_7a8);
      }
      bVar1 = local_76c == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_7bc);
    }
  }
  llvm::StringLiteral::StringLiteral<5UL>(&local_ea8,(char (*) [5])"nacl");
  local_818 = local_ea8.super_StringRef.Data;
  local_810 = (char *)local_ea8.super_StringRef.Length;
  local_824 = NaCl;
  local_820 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_838 = local_818;
    local_830 = local_810;
    local_800 = local_818;
    local_7f8 = local_810;
    bVar1 = false;
    local_808 = &local_d58;
    if (local_810 <= local_d50) {
      local_7e0 = local_d58;
      local_7e8 = local_818;
      local_7f0 = local_810;
      if (local_810 == (char *)0x0) {
        local_7d4 = 0;
      }
      else {
        local_7d4 = memcmp(local_d58,local_818,(size_t)local_810);
      }
      bVar1 = local_7d4 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_824);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_eb8,(char (*) [4])"cnk");
  local_880 = local_eb8.super_StringRef.Data;
  local_878 = (char *)local_eb8.super_StringRef.Length;
  local_88c = CNK;
  local_888 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_8a0 = local_880;
    local_898 = local_878;
    local_868 = local_880;
    local_860 = local_878;
    bVar1 = false;
    local_870 = &local_d58;
    if (local_878 <= local_d50) {
      local_848 = local_d58;
      local_850 = local_880;
      local_858 = local_878;
      if (local_878 == (char *)0x0) {
        local_83c = 0;
      }
      else {
        local_83c = memcmp(local_d58,local_880,(size_t)local_878);
      }
      bVar1 = local_83c == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_88c);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_ec8,(char (*) [4])"aix");
  local_8e8 = local_ec8.super_StringRef.Data;
  local_8e0 = (char *)local_ec8.super_StringRef.Length;
  local_8f4 = AIX;
  local_8f0 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_908 = local_8e8;
    local_900 = local_8e0;
    local_8d0 = local_8e8;
    local_8c8 = local_8e0;
    bVar1 = false;
    local_8d8 = &local_d58;
    if (local_8e0 <= local_d50) {
      local_8b0 = local_d58;
      local_8b8 = local_8e8;
      local_8c0 = local_8e0;
      if (local_8e0 == (char *)0x0) {
        local_8a4 = 0;
      }
      else {
        local_8a4 = memcmp(local_d58,local_8e8,(size_t)local_8e0);
      }
      bVar1 = local_8a4 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_8f4);
    }
  }
  llvm::StringLiteral::StringLiteral<5UL>(&local_ed8,(char (*) [5])"cuda");
  local_950 = local_ed8.super_StringRef.Data;
  local_948 = (char *)local_ed8.super_StringRef.Length;
  local_95c = CUDA;
  local_958 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_970 = local_950;
    local_968 = local_948;
    local_938 = local_950;
    local_930 = local_948;
    bVar1 = false;
    local_940 = &local_d58;
    if (local_948 <= local_d50) {
      local_918 = local_d58;
      local_920 = local_950;
      local_928 = local_948;
      if (local_948 == (char *)0x0) {
        local_90c = 0;
      }
      else {
        local_90c = memcmp(local_d58,local_950,(size_t)local_948);
      }
      bVar1 = local_90c == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_95c);
    }
  }
  llvm::StringLiteral::StringLiteral<5UL>(&local_ee8,(char (*) [5])"nvcl");
  local_9b8 = local_ee8.super_StringRef.Data;
  local_9b0 = (char *)local_ee8.super_StringRef.Length;
  local_9c4 = NVCL;
  local_9c0 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_9d8 = local_9b8;
    local_9d0 = local_9b0;
    local_9a0 = local_9b8;
    local_998 = local_9b0;
    bVar1 = false;
    local_9a8 = &local_d58;
    if (local_9b0 <= local_d50) {
      local_980 = local_d58;
      local_988 = local_9b8;
      local_990 = local_9b0;
      if (local_9b0 == (char *)0x0) {
        local_974 = 0;
      }
      else {
        local_974 = memcmp(local_d58,local_9b8,(size_t)local_9b0);
      }
      bVar1 = local_974 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_9c4);
    }
  }
  llvm::StringLiteral::StringLiteral<7UL>(&local_ef8,(char (*) [7])"amdhsa");
  local_a20 = local_ef8.super_StringRef.Data;
  local_a18 = (char *)local_ef8.super_StringRef.Length;
  local_a2c = AMDHSA;
  local_a28 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_a40 = local_a20;
    local_a38 = local_a18;
    local_a08 = local_a20;
    local_a00 = local_a18;
    bVar1 = false;
    local_a10 = &local_d58;
    if (local_a18 <= local_d50) {
      local_9e8 = local_d58;
      local_9f0 = local_a20;
      local_9f8 = local_a18;
      if (local_a18 == (char *)0x0) {
        local_9dc = 0;
      }
      else {
        local_9dc = memcmp(local_d58,local_a20,(size_t)local_a18);
      }
      bVar1 = local_9dc == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_a2c);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_f08,(char (*) [4])"ps4");
  local_a88 = local_f08.super_StringRef.Data;
  local_a80 = (char *)local_f08.super_StringRef.Length;
  local_a94 = PS4;
  local_a90 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_aa8 = local_a88;
    local_aa0 = local_a80;
    local_a70 = local_a88;
    local_a68 = local_a80;
    bVar1 = false;
    local_a78 = &local_d58;
    if (local_a80 <= local_d50) {
      local_a50 = local_d58;
      local_a58 = local_a88;
      local_a60 = local_a80;
      if (local_a80 == (char *)0x0) {
        local_a44 = 0;
      }
      else {
        local_a44 = memcmp(local_d58,local_a88,(size_t)local_a80);
      }
      bVar1 = local_a44 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_a94);
    }
  }
  llvm::StringLiteral::StringLiteral<9UL>(&local_f18,(char (*) [9])"elfiamcu");
  local_af0 = local_f18.super_StringRef.Data;
  local_ae8 = (char *)local_f18.super_StringRef.Length;
  local_afc = ELFIAMCU;
  local_af8 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_b10 = local_af0;
    local_b08 = local_ae8;
    local_ad8 = local_af0;
    local_ad0 = local_ae8;
    bVar1 = false;
    local_ae0 = &local_d58;
    if (local_ae8 <= local_d50) {
      local_ab8 = local_d58;
      local_ac0 = local_af0;
      local_ac8 = local_ae8;
      if (local_ae8 == (char *)0x0) {
        local_aac = 0;
      }
      else {
        local_aac = memcmp(local_d58,local_af0,(size_t)local_ae8);
      }
      bVar1 = local_aac == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_afc);
    }
  }
  llvm::StringLiteral::StringLiteral<5UL>(&local_f28,(char (*) [5])"tvos");
  local_b58 = local_f28.super_StringRef.Data;
  local_b50 = (char *)local_f28.super_StringRef.Length;
  local_b64 = TvOS;
  local_b60 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_b78 = local_b58;
    local_b70 = local_b50;
    local_b40 = local_b58;
    local_b38 = local_b50;
    bVar1 = false;
    local_b48 = &local_d58;
    if (local_b50 <= local_d50) {
      local_b20 = local_d58;
      local_b28 = local_b58;
      local_b30 = local_b50;
      if (local_b50 == (char *)0x0) {
        local_b14 = 0;
      }
      else {
        local_b14 = memcmp(local_d58,local_b58,(size_t)local_b50);
      }
      bVar1 = local_b14 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_b64);
    }
  }
  llvm::StringLiteral::StringLiteral<8UL>(&local_f38,(char (*) [8])"watchos");
  local_bc0 = local_f38.super_StringRef.Data;
  local_bb8 = (char *)local_f38.super_StringRef.Length;
  local_bcc = WatchOS;
  local_bc8 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_be0 = local_bc0;
    local_bd8 = local_bb8;
    local_ba8 = local_bc0;
    local_ba0 = local_bb8;
    bVar1 = false;
    local_bb0 = &local_d58;
    if (local_bb8 <= local_d50) {
      local_b88 = local_d58;
      local_b90 = local_bc0;
      local_b98 = local_bb8;
      if (local_bb8 == (char *)0x0) {
        local_b7c = 0;
      }
      else {
        local_b7c = memcmp(local_d58,local_bc0,(size_t)local_bb8);
      }
      bVar1 = local_b7c == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_bcc);
    }
  }
  llvm::StringLiteral::StringLiteral<7UL>(&local_f48,(char (*) [7])"mesa3d");
  local_c28 = local_f48.super_StringRef.Data;
  local_c20 = (char *)local_f48.super_StringRef.Length;
  local_c34 = Mesa3D;
  local_c30 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_c48 = local_c28;
    local_c40 = local_c20;
    local_c10 = local_c28;
    local_c08 = local_c20;
    bVar1 = false;
    local_c18 = &local_d58;
    if (local_c20 <= local_d50) {
      local_bf0 = local_d58;
      local_bf8 = local_c28;
      local_c00 = local_c20;
      if (local_c20 == (char *)0x0) {
        local_be4 = 0;
      }
      else {
        local_be4 = memcmp(local_d58,local_c28,(size_t)local_c20);
      }
      bVar1 = local_be4 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_c34);
    }
  }
  llvm::StringLiteral::StringLiteral<8UL>(&local_f58,(char (*) [8])"contiki");
  local_c90 = local_f58.super_StringRef.Data;
  local_c88 = (char *)local_f58.super_StringRef.Length;
  local_c9c = Contiki;
  local_c98 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_cb0 = local_c90;
    local_ca8 = local_c88;
    local_c78 = local_c90;
    local_c70 = local_c88;
    bVar1 = false;
    local_c80 = &local_d58;
    if (local_c88 <= local_d50) {
      local_c58 = local_d58;
      local_c60 = local_c90;
      local_c68 = local_c88;
      if (local_c88 == (char *)0x0) {
        local_c4c = 0;
      }
      else {
        local_c4c = memcmp(local_d58,local_c90,(size_t)local_c88);
      }
      bVar1 = local_c4c == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_c9c);
    }
  }
  llvm::StringLiteral::StringLiteral<7UL>(&local_f68,(char (*) [7])"amdpal");
  local_cf8 = local_f68.super_StringRef.Data;
  local_cf0 = (char *)local_f68.super_StringRef.Length;
  local_d04 = AMDPAL;
  local_d00 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (!bVar1) {
    local_ce0 = local_cf8;
    local_cd8 = local_cf0;
    bVar1 = false;
    local_ce8 = &local_d58;
    if (local_cf0 <= local_d50) {
      local_cc0 = local_d58;
      local_cc8 = local_cf8;
      local_cd0 = local_cf0;
      if (local_cf0 == (char *)0x0) {
        local_cb4 = 0;
      }
      else {
        local_cb4 = memcmp(local_d58,local_cf8,(size_t)local_cf0);
      }
      bVar1 = local_cb4 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::OSType>::operator=(&OStack_d48,&local_d04);
    }
  }
  local_1c = UnknownOS;
  local_18 = &local_d58;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
  if (bVar1) {
    pOVar2 = llvm::Optional<llvm::Triple::OSType>::operator*(&OStack_d48);
    local_c = *pOVar2;
  }
  else {
    local_c = local_1c;
  }
  return local_c;
}

Assistant:

static Triple::OSType parseOS(StringRef OSName) {
  return StringSwitch<Triple::OSType>(OSName)
    .StartsWith("ananas", Triple::Ananas)
    .StartsWith("cloudabi", Triple::CloudABI)
    .StartsWith("darwin", Triple::Darwin)
    .StartsWith("dragonfly", Triple::DragonFly)
    .StartsWith("freebsd", Triple::FreeBSD)
    .StartsWith("fuchsia", Triple::Fuchsia)
    .StartsWith("ios", Triple::IOS)
    .StartsWith("kfreebsd", Triple::KFreeBSD)
    .StartsWith("linux", Triple::Linux)
    .StartsWith("lv2", Triple::Lv2)
    .StartsWith("macos", Triple::MacOSX)
    .StartsWith("netbsd", Triple::NetBSD)
    .StartsWith("openbsd", Triple::OpenBSD)
    .StartsWith("solaris", Triple::Solaris)
    .StartsWith("win32", Triple::Win32)
    .StartsWith("windows", Triple::Win32)
    .StartsWith("haiku", Triple::Haiku)
    .StartsWith("minix", Triple::Minix)
    .StartsWith("rtems", Triple::RTEMS)
    .StartsWith("nacl", Triple::NaCl)
    .StartsWith("cnk", Triple::CNK)
    .StartsWith("aix", Triple::AIX)
    .StartsWith("cuda", Triple::CUDA)
    .StartsWith("nvcl", Triple::NVCL)
    .StartsWith("amdhsa", Triple::AMDHSA)
    .StartsWith("ps4", Triple::PS4)
    .StartsWith("elfiamcu", Triple::ELFIAMCU)
    .StartsWith("tvos", Triple::TvOS)
    .StartsWith("watchos", Triple::WatchOS)
    .StartsWith("mesa3d", Triple::Mesa3D)
    .StartsWith("contiki", Triple::Contiki)
    .StartsWith("amdpal", Triple::AMDPAL)
    .Default(Triple::UnknownOS);
}